

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
~vector(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *this)

{
  memory_resource *pmVar1;
  
  clear(this);
  if (this->ptr != (PiecewiseConstant1D *)0x0) {
    pmVar1 = (this->alloc).memoryResource;
    (*pmVar1->_vptr_memory_resource[3])(pmVar1,this->ptr,this->nAlloc * 0x50,8);
  }
  return;
}

Assistant:

~vector() {
        clear();
        alloc.deallocate_object(ptr, nAlloc);
    }